

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::setPlaceholderText(QLineEdit *this,QString *placeholderText)

{
  QLineEditPrivate *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  QStringView QVar5;
  QStringView QVar6;
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  lVar1 = (this_00->placeholderText).d.size;
  lVar2 = (placeholderText->d).size;
  if ((lVar1 == lVar2) &&
     (QVar5.m_data = (this_00->placeholderText).d.ptr, QVar5.m_size = lVar1,
     QVar6.m_data = (placeholderText->d).ptr, QVar6.m_size = lVar2,
     cVar3 = QtPrivate::equalStrings(QVar5,QVar6), cVar3 != '\0')) {
    return;
  }
  QString::operator=(&this_00->placeholderText,(QString *)placeholderText);
  bVar4 = QLineEditPrivate::shouldShowPlaceholderText(this_00);
  if (!bVar4) {
    return;
  }
  QWidget::update(&this->super_QWidget);
  return;
}

Assistant:

void QLineEdit::setPlaceholderText(const QString& placeholderText)
{
    Q_D(QLineEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        if (d->shouldShowPlaceholderText())
            update();
    }
}